

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

symbol * dmrC_evaluate_expression(dmr_C *C,expression *expr)

{
  expression **ppeVar1;
  byte *pbVar2;
  void **rp;
  byte bVar3;
  ptr_list *ppVar4;
  _func_int_dmr_C_ptr_expression_ptr *p_Var5;
  statement *psVar6;
  allocator *paVar7;
  statement *psVar8;
  statement *psVar9;
  symbol_list *psVar10;
  statement *psVar11;
  undefined8 uVar12;
  statement *psVar13;
  statement *psVar14;
  ident *piVar15;
  anon_union_8_2_e1606681_for_symbol_12 aVar16;
  ctype *pcVar17;
  statement_type sVar18;
  undefined4 uVar19;
  char cVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  expression_list *peVar25;
  symbol *psVar26;
  expression *peVar27;
  expression *peVar28;
  target_t *ptVar29;
  expression_list *peVar30;
  expression_list *peVar31;
  char *pcVar32;
  expression *peVar33;
  symbol *psVar34;
  ulong uVar35;
  symbol *psVar36;
  symbol *psVar37;
  symbol *psVar38;
  unsigned_long uVar39;
  unsigned_long uVar40;
  uint *offset;
  statement_list *psVar41;
  int iVar42;
  char *pcVar43;
  char *fmt;
  char *pcVar44;
  dmr_C *type;
  position pVar45;
  global_symbols_t *pgVar46;
  uint uVar47;
  dmr_C *pdVar48;
  statement_list *type_00;
  anon_union_32_18_55d8ca1e_for_expression_5 *paVar49;
  long lVar50;
  bool bVar51;
  bool bVar52;
  char *local_b0;
  undefined1 local_a8 [8];
  ptr_list_iter expriter__;
  ptr_list *local_88;
  symbol *t_1;
  ptr_list_iter argtypeiter__;
  symbol *t1;
  symbol *local_38;
  
  if (expr == (expression *)0x0) {
    return (symbol *)0x0;
  }
  if (expr->ctype != (symbol *)0x0) {
    return expr->ctype;
  }
  offset = &switchD_00109e09::switchdataD_00131808;
  switch(*(undefined1 *)expr) {
  case 1:
  case 0x1c:
    pcVar43 = "value expression without a type";
    break;
  case 2:
    peVar25 = (expression_list *)dmrC_alloc_symbol(C->S,expr->pos,3);
    psVar26 = dmrC_alloc_symbol(C->S,expr->pos,6);
    psVar37 = (symbol *)dmrC_alloc_expression(C,expr->pos,3);
    peVar28 = dmrC_alloc_expression(C,expr->pos,2);
    uVar23 = (uint)*(expr->field_5).field_2.string & 0x7fffffff;
    peVar27 = dmrC_alloc_const_expression(C,expr->pos,uVar23);
    peVar25->list_[7] = peVar27;
    *(uint *)(peVar25->list_ + 6) = C->target->bits_in_char * uVar23;
    peVar25->list_[9] = (expression *)0x1;
    pbVar2 = (byte *)((long)peVar25->list_ + 0x36);
    *pbVar2 = *pbVar2 | 0x80;
    peVar25->list_[8] = (expression *)0x4;
    peVar25->list_[0xc] = (expression *)psVar26;
    peVar25->list_[0x12] = peVar28;
    peVar28->ctype = (symbol *)peVar25;
    (peVar28->field_5).field_2.string = (expr->field_5).field_2.string;
    (psVar26->field_14).field_0.used_in = (scope *)peVar25->list_[7];
    (psVar26->field_14).field_1.normal = uVar23 * C->target->bits_in_char;
    (psVar26->field_14).field_2.ctype.alignment = 1;
    (psVar26->field_14).field_2.ctype.modifiers = 4;
    (psVar26->field_14).field_2.ctype.base_type = &C->S->char_ctype;
    ((anon_union_32_18_55d8ca1e_for_expression_5 *)&psVar37->next_id)->expr_list = peVar25;
    *(symbol **)&(psVar37->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
    *(undefined1 *)expr = 9;
    expr->op = 0x2a;
    (expr->field_5).field_4.symbol = psVar37;
    argtypeiter__._16_8_ = peVar25;
    goto LAB_0010b50a;
  case 3:
    peVar25 = (expression_list *)(expr->field_5).field_4.symbol;
    if (peVar25 == (expression_list *)0x0) {
      pcVar43 = dmrC_show_ident(C,(expr->field_5).field_4.symbol_name);
      pcVar44 = "undefined identifier \'%s\'";
    }
    else {
      dmrC_examine_symbol_type(C->S,(symbol *)peVar25);
      psVar26 = dmrC_get_base_type(C->S,(symbol *)peVar25);
      if (psVar26 != (symbol *)0x0) {
        psVar26 = (symbol *)dmrC_alloc_expression(C,expr->pos,3);
        (((anon_union_32_18_55d8ca1e_for_expression_5 *)&psVar26->next_id)->field_4).symbol =
             (symbol *)peVar25;
        psVar26->replace = (symbol *)(expr->field_5).field_2.string;
        *(symbol **)&(psVar26->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
        *(undefined1 *)expr = 9;
        expr->op = 0x2a;
        (expr->field_5).field_4.symbol = psVar26;
        argtypeiter__._16_8_ = peVar25;
        goto LAB_0010b50a;
      }
      pcVar43 = dmrC_show_ident(C,(expr->field_5).field_4.symbol_name);
      pcVar44 = "identifier \'%s\' has no type";
    }
    goto LAB_0010af5e;
  case 4:
    evaluate_symbol(C,(expr->field_5).field_4.symbol);
    lVar50 = 0x3a8;
    goto LAB_0010b22c;
  case 5:
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    uVar23 = classify_type(C,((expr->field_5).field_3.unop)->ctype,(symbol **)local_a8);
    uVar21 = classify_type(C,((expr->field_5).field_6.right)->ctype,(symbol **)&local_88);
    if ((0xff < *(ushort *)expr) &&
       (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(expr->field_5).field_2.string) >> 8
        & 1) == 0)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    uVar24 = expr->op;
    if ((uVar21 & uVar23 & 1) != 0) {
      if ((((uVar21 | uVar23) & 8) == 0) ||
         ((uVar24 < 0x30 && ((0xac0000000000U >> ((ulong)uVar24 & 0x3f) & 1) != 0)))) {
        peVar28 = (expr->field_5).field_3.unop;
        if ((uVar24 & 0xfffffffe) == 0x112) {
          unrestrict(C,peVar28,uVar23,(symbol **)local_a8);
          unrestrict(C,(expr->field_5).field_6.right,uVar21,(symbol **)&local_88);
          peVar25 = (expression_list *)integer_promotion(C,(symbol *)local_a8);
          peVar31 = (expression_list *)integer_promotion(C,(symbol *)local_88);
        }
        else {
          if (*(char *)peVar28 == '\t') {
            bVar51 = peVar28->op == 0x21;
          }
          else {
            bVar51 = false;
          }
          peVar27 = (expr->field_5).field_6.right;
          if (*(char *)peVar27 == '\t') {
            bVar52 = peVar27->op == 0x21;
          }
          else {
            bVar52 = false;
          }
          if (((uVar24 == 0x7c) || (uVar24 == 0x26)) && ((bool)(bVar51 | bVar52))) {
            pcVar44 = "";
            pcVar43 = "";
            if (bVar51) {
              pcVar43 = "!";
            }
            if (bVar52) {
              pcVar44 = "!";
            }
            dmrC_warning(C,expr->pos,"dubious: %sx %c %sy",pcVar43,(ulong)uVar24,pcVar44);
            peVar28 = (expr->field_5).field_3.unop;
            peVar27 = (expr->field_5).field_6.right;
          }
          peVar31 = (expression_list *)
                    usual_conversions(C,uVar24,peVar28,peVar27,uVar23,uVar21,(symbol *)local_a8,
                                      (symbol *)local_88);
          peVar25 = peVar31;
        }
        peVar28 = cast_to(C,(expr->field_5).field_3.unop,(symbol *)peVar25);
        (expr->field_5).field_3.unop = peVar28;
        peVar28 = cast_to(C,(expr->field_5).field_6.right,(symbol *)peVar31);
        (expr->field_5).field_6.right = peVar28;
        argtypeiter__._16_8_ = peVar25;
        goto LAB_0010b50a;
      }
      goto LAB_0010c0c0;
    }
    if ((((uVar23 & 0x10) != 0) && ((uVar21 & 9) == 1)) && ((uVar24 == 0x2d || (uVar24 == 0x2b)))) {
      unrestrict(C,(expr->field_5).field_6.right,uVar21,(symbol **)&local_88);
LAB_0010b34a:
      psVar26 = evaluate_ptr_add(C,expr,(symbol *)local_88);
      return psVar26;
    }
    if (((uVar21 & 0x10) != 0) && (uVar24 == 0x2b && (uVar23 & 9) == 1)) {
      peVar28 = (expr->field_5).field_3.unop;
      unrestrict(C,peVar28,uVar23,(symbol **)local_a8);
      (expr->field_5).field_0.value = (unsigned_long_long)(expr->field_5).field_2.string;
      (expr->field_5).field_6.right = peVar28;
      local_88 = (ptr_list *)local_a8;
      goto LAB_0010b34a;
    }
    if ((uVar24 == 0x2d & (byte)(uVar21 & uVar23) >> 4) != 1) goto LAB_0010c0c0;
    peVar28 = (expr->field_5).field_3.unop;
    peVar27 = (expr->field_5).field_6.right;
    psVar26 = degenerate(C,peVar28);
    classify_type(C,psVar26,(symbol **)&argtypeiter__.__nr);
    psVar26 = degenerate(C,peVar27);
    classify_type(C,psVar26,&t_1);
    uVar12 = argtypeiter__._16_8_;
    psVar38 = dmrC_examine_pointer_target(C->S,(symbol *)argtypeiter__._16_8_);
    psVar26 = t_1;
    psVar37 = t_1;
    dmrC_examine_pointer_target(C->S,t_1);
    uVar39 = target_qualifiers((dmr_C *)psVar26,psVar37);
    uVar40 = target_qualifiers((dmr_C *)uVar12,psVar37);
    pcVar43 = dmrC_type_difference
                        (C,(ctype *)(uVar12 + 0x60),&(psVar26->field_14).field_2.ctype,uVar39,uVar40
                        );
    if (pcVar43 != (char *)0x0) {
      dmrC_expression_error(C,expr,"subtraction of different types can\'t work (%s)",pcVar43);
    }
    if ((psVar38 == (symbol *)0x0) || (*(char *)psVar38 != '\x05')) {
      ptVar29 = C->target;
      psVar26 = ptVar29->ssize_t_ctype;
      expr->ctype = psVar26;
      if (ptVar29->bits_in_char < (psVar38->field_14).field_1.normal) {
        peVar25 = (expression_list *)dmrC_alloc_expression(C,expr->pos,5);
        peVar33 = dmrC_alloc_expression(C,expr->pos,1);
        iVar22 = (psVar38->field_14).field_1.normal;
        if (iVar22 < 0) {
          uVar35 = 0xffffffffffffffff;
        }
        else {
          iVar42 = C->target->bits_in_char;
          uVar35 = (ulong)((iVar22 + iVar42 + -1) / iVar42);
        }
        peVar33->ctype = C->target->size_t_ctype;
        (peVar33->field_5).field_0.value = uVar35;
        if (((uVar35 & uVar35 - 1) != 0) && (C->Wptr_subtraction_blows != 0)) {
          dmrC_warning(C,expr->pos,"potentially expensive pointer subtraction");
        }
        *(int *)&peVar25->field_0x4 = 0x2d;
        peVar25->next_ = (expression_list *)C->target->ssize_t_ctype;
        (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar25->list_)->field_3).unop = peVar28;
        (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar25->list_)->field_6).right = peVar27;
        expr->op = 0x2f;
        (expr->field_5).expr_list = peVar25;
        (expr->field_5).field_6.right = peVar33;
        return C->target->ssize_t_ctype;
      }
      return psVar26;
    }
    pcVar43 = "subtraction of functions? Share your drugs";
    break;
  case 6:
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    peVar28 = (expr->field_5).field_3.unop;
    if ((*(char *)peVar28 == '\t') && (peVar28->op == 0x2a)) {
      ppeVar1 = &(expr->field_5).field_6.right;
      peVar25 = (expression_list *)peVar28->ctype;
      if (expr->op == 0x3d) {
        iVar22 = compatible_assignment_types(C,expr,(symbol *)peVar25,ppeVar1,"assignment");
        if (iVar22 == 0) {
          return (symbol *)0x0;
        }
      }
      else {
        psVar26 = ((expr->field_5).field_6.right)->ctype;
        uVar21 = classify_type(C,(symbol *)peVar25,(symbol **)&argtypeiter__.__nr);
        uVar24 = classify_type(C,psVar26,&t_1);
        uVar23 = expr->op;
        if ((uVar21 & uVar24 & 1) == 0) {
          if ((uVar21 != 0x10) || ((uVar24 & 9) != 1)) {
LAB_0010bfcb:
            pcVar43 = "invalid assignment";
LAB_0010aba2:
            dmrC_expression_error(C,expr,pcVar43);
            return (symbol *)0x0;
          }
          if ((uVar23 & 0xfffffffd) != 0x100) {
            pcVar43 = "invalid pointer assignment";
            goto LAB_0010aba2;
          }
          unrestrict(C,(expr->field_5).field_6.right,uVar24,&t_1);
          evaluate_ptr_add(C,expr,t_1);
        }
        else {
          if (((uVar21 & 8) != 0) &&
             ((6 < uVar23 - 0x100 || ((0x65U >> (uVar23 - 0x100 & 0x1f) & 1) == 0))))
          goto LAB_0010bfcb;
          if ((uVar21 & 4) == 0) {
            if ((uVar24 & 4) != 0) {
LAB_0010bf34:
              if ((symbol *)argtypeiter__._16_8_ != t_1) {
                pcVar43 = dmrC_show_special(C,uVar23);
                dmrC_warning(C,expr->pos,"invalid assignment: %s",pcVar43);
                pcVar43 = dmrC_show_typename(C,(symbol *)argtypeiter__._16_8_);
                dmrC_info(C,expr->pos,"   left side has type %s",pcVar43);
                pcVar43 = dmrC_show_typename(C,t_1);
                dmrC_info(C,expr->pos,"   right side has type %s",pcVar43);
                peVar28 = (expr->field_5).field_6.right;
LAB_0010c240:
                peVar28 = cast_to(C,peVar28,(symbol *)peVar25);
                (expr->field_5).field_6.right = peVar28;
                return (symbol *)0x0;
              }
              goto LAB_0010bfb8;
            }
            peVar31 = (expression_list *)
                      usual_conversions(C,uVar23,(expr->field_5).field_3.unop,
                                        (expr->field_5).field_6.right,uVar21,uVar24,
                                        (symbol *)peVar25,psVar26);
          }
          else {
            iVar22 = restricted_binop(uVar23);
            if (iVar22 == 0) {
              pcVar43 = dmrC_show_special(C,uVar23);
              pcVar44 = dmrC_show_typename(C,(symbol *)argtypeiter__._16_8_);
              dmrC_warning(C,expr->pos,"bad assignment (%s) to %s",pcVar43,pcVar44);
              peVar28 = (expr->field_5).field_6.right;
              goto LAB_0010c240;
            }
            if (((uVar24 & 0x40) == 0) ||
               (peVar31 = peVar25,
               (t_1->field_14).field_2.ctype.base_type != (symbol *)argtypeiter__._16_8_)) {
              if ((*(char *)*ppeVar1 == '\x01') && (((*ppeVar1)->field_5).field_0.value == 0))
              goto LAB_0010bfb8;
              goto LAB_0010bf34;
            }
          }
          peVar27 = cast_to(C,*ppeVar1,(symbol *)peVar31);
          *ppeVar1 = peVar27;
        }
      }
LAB_0010bfb8:
      evaluate_assign_to(C,peVar28,(symbol *)peVar25);
      argtypeiter__._16_8_ = peVar25;
      goto LAB_0010b50a;
    }
    pcVar43 = "not an lvalue";
    break;
  case 7:
    psVar26 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = evaluate_conditional(C,(expr->field_5).field_6.right,0);
    if (psVar26 != (symbol *)0x0) {
      pgVar46 = C->S;
      expr->ctype = &pgVar46->int_ctype;
      if ((0xff < *(ushort *)expr) &&
         (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(expr->field_5).field_2.string) >>
           8 & 1) == 0)) {
        *(ushort *)expr = *(ushort *)expr & 0xff;
        pgVar46 = C->S;
      }
      return &pgVar46->int_ctype;
    }
    return (symbol *)0x0;
  case 8:
    peVar31 = (expr->field_5).expr_list;
    pdVar48 = (dmr_C *)(expr->field_5).field_4.symbol_name;
    psVar26 = dmrC_evaluate_expression(C,(expression *)peVar31);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    if (pdVar48 != (dmr_C *)0x0) {
      peVar30 = peVar31->next_;
      dmrC_examine_symbol_type(C->S,(symbol *)peVar30);
      uVar23 = *(uint *)(peVar30->list_ + 0xb);
      uVar21 = (uint)peVar30->list_[8];
      bVar3 = *(byte *)peVar30;
      if (bVar3 == 3) {
        peVar30 = (expression_list *)peVar30->list_[0xc];
        uVar23 = uVar23 | *(uint *)(peVar30->list_ + 0xb);
        uVar21 = uVar21 | (uint)peVar30->list_[8];
        bVar3 = *(byte *)peVar30;
      }
      if (1 < bVar3 - 7) {
        pcVar43 = "expected structure or union";
LAB_0010afff:
        psVar26 = (symbol *)0x0;
        goto LAB_0010b9a0;
      }
      argtypeiter__._16_8_ = argtypeiter__._16_8_ & 0xffffffff00000000;
      peVar25 = (expression_list *)
                find_identifier(pdVar48,(ident *)peVar30->list_[0xf],
                                (symbol_list *)&argtypeiter__.__nr,(int *)(ulong)uVar23);
      if (peVar25 == (expression_list *)0x0) {
        pcVar43 = "union";
        if (*(byte *)peVar30 == 7) {
          pcVar43 = "struct";
        }
        paVar7 = peVar30->allocator_;
        if (paVar7 == (allocator *)0x0) {
          uVar23 = 9;
          pcVar44 = "<unnamed>";
        }
        else {
          uVar23 = (uint)(byte)paVar7->size_;
          pcVar44 = (char *)((long)&paVar7->size_ + 2);
        }
        lVar50 = (long)peVar30->list_[0xf];
        pcVar32 = dmrC_show_ident(C,(ident *)pdVar48);
        if (lVar50 == 0) {
          fmt = "using member \'%s\' in incomplete %s %.*s";
        }
        else {
          fmt = "no member \'%s\' in %s %.*s";
        }
        dmrC_expression_error(C,expr,fmt,pcVar32,pcVar43,uVar23,pcVar44);
        return (symbol *)0x0;
      }
      uVar24 = (uint)peVar25->list_[8];
      uVar21 = uVar21 | uVar24;
      if ((*(uint *)(peVar25->list_ + 0xb) != uVar23) || (uVar21 != uVar24)) {
        peVar30 = (expression_list *)dmrC_alloc_symbol(C->S,*(position *)&peVar25->field_0x4,3);
        memcpy(peVar30,peVar25,0xe8);
        *(uint *)(peVar30->list_ + 0xb) = uVar23;
        peVar30->list_[8] = (expression *)(long)(int)uVar21;
        peVar25 = peVar30;
      }
      dmrC_get_base_type(C->S,(symbol *)peVar25);
      if (*(char *)peVar31 == '\x1d') {
        (expr->field_5).field_0.value =
             (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar31->list_)->field_0).value;
        uVar23 = (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar31->list_)->field_0).taint;
      }
      else {
        if ((*(char *)peVar31 == '\t') && (*(int *)&peVar31->field_0x4 == 0x2a)) {
          peVar28 = (((anon_union_32_18_55d8ca1e_for_expression_5 *)peVar31->list_)->field_3).unop;
          (expr->field_5).field_3.unop = peVar28;
          psVar37 = (symbol *)(long)argtypeiter__.__nr;
          psVar26 = (symbol *)dmrC_alloc_expression(C,peVar28->pos,5);
          *(int *)&psVar26->pos = 0x2b;
          (((anon_union_32_18_55d8ca1e_for_expression_5 *)&psVar26->next_id)->field_3).unop =
               peVar28;
          psVar38 = (symbol *)dmrC_alloc_expression(C,peVar28->pos,1);
          psVar26->replace = psVar38;
          *(symbol **)&(psVar38->endpos).field_0x4 = &C->S->int_ctype;
          psVar26->replace->next_id = psVar37;
          *(symbol **)&(psVar26->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
          goto LAB_00109e6b;
        }
        (expr->field_5).expr_list = peVar31;
        uVar23 = 0;
      }
      (expr->field_5).field_0.taint = uVar23;
      uVar23 = C->target->bits_in_char * argtypeiter__.__nr + uVar23;
      (expr->field_5).field_0.taint = uVar23;
      *(undefined1 *)expr = 0x1d;
      (expr->field_5).field_8.r_nrbits = *(uint *)(peVar25->list_ + 6);
      (expr->field_5).field_0.taint = *(byte *)((long)peVar25->list_ + 0x34) + uVar23;
      argtypeiter__._16_8_ = peVar25;
      goto LAB_0010b50a;
    }
    pcVar43 = "bad member name";
    break;
  case 9:
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar6 = (expr->field_5).statement;
    type_00 = (psVar6->field_2).field_4.stmts;
    iVar22 = expr->op;
    switch(iVar22) {
    case 0x21:
      if ((0xff < *(ushort *)expr) && ((psVar6->type & 0x100) == STMT_NONE)) {
        *(ushort *)expr = *(ushort *)expr & 0xff;
      }
      if ((*(byte *)((long)type_00->list_ + 0x43) & 8) != 0) {
        dmrC_warning(C,expr->pos,"testing a \'safe expression\'");
      }
      psVar41 = type_00;
      if (*(char *)type_00 == '\x03') {
        psVar41 = (statement_list *)type_00->list_[0xc];
      }
      if ((symbol *)psVar41->list_[0xc] == &C->S->fp_type) {
        *(undefined1 *)expr = 0x16;
        expr->op = 0x10a;
        peVar28 = dmrC_alloc_expression(C,expr->pos,0x1c);
        (expr->field_5).field_6.right = peVar28;
        peVar28->ctype = (symbol *)type_00;
        (((expr->field_5).field_6.right)->field_5).fvalue = (longdouble)0;
      }
      else {
        iVar22 = dmrC_get_sym_type((symbol *)type_00);
        if (iVar22 == 0x10) {
          pcVar43 = dmrC_show_typename(C,(symbol *)type_00->list_[0xc]);
          dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar43);
        }
      }
      type_00 = (statement_list *)&C->S->int_ctype;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x27:
    case 0x29:
    case 0x2c:
switchD_0010a78f_caseD_22:
      expr->ctype = (symbol *)type_00;
      return (symbol *)type_00;
    case 0x26:
      if ((*(int *)&psVar6->pos == 0x2a) && ((char)psVar6->type == STMT_LABEL)) {
        psVar6 = (psVar6->field_2).field_3.if_false;
        uVar19 = *(undefined4 *)&(psVar6->pos).field_0x0;
        pVar45 = *(position *)&(psVar6->pos).field_0x4;
        psVar10 = (psVar6->field_2).field_0.declaration;
        peVar28 = (psVar6->field_2).field_1.context;
        psVar8 = (psVar6->field_2).field_3.if_false;
        psVar9 = (psVar6->field_2).field_4.args;
        peVar27 = (psVar6->field_2).field_8.iterator_pre_condition;
        psVar11 = (psVar6->field_2).field_8.iterator_statement;
        *(statement_type *)&expr->field_0x0 = psVar6->type;
        expr->op = uVar19;
        expr->pos = pVar45;
        (expr->field_5).field_10.cond_false = peVar27;
        (expr->field_5).field_14.ident_expression = (expression *)psVar11;
        (expr->field_5).field_0.value = (unsigned_long_long)psVar8;
        (expr->field_5).field_2.string = (string *)psVar9;
        expr->ctype = (symbol *)psVar10;
        *(expression **)&expr->field_0x18 = peVar28;
        bVar3 = *(byte *)expr;
        *(ushort *)expr = (ushort)bVar3;
        if (bVar3 == 3) {
          ppeVar1 = ((expr->field_5).expr_list)->list_ + 8;
          *ppeVar1 = (expression *)((ulong)*ppeVar1 | 0x80000);
        }
        if (expr->ctype != &C->S->lazy_ptr_ctype) {
          return expr->ctype;
        }
        psVar26 = create_pointer(C,expr,(symbol *)type_00,0);
        goto LAB_0010a6b5;
      }
      pcVar43 = "not addressable";
      goto LAB_0010b997;
    case 0x28:
      sVar18 = psVar6->type;
      uVar19 = *(undefined4 *)&(psVar6->pos).field_0x0;
      pVar45 = *(position *)&(psVar6->pos).field_0x4;
      psVar10 = (psVar6->field_2).field_0.declaration;
      peVar28 = (psVar6->field_2).field_1.context;
      psVar8 = (psVar6->field_2).field_3.if_false;
      psVar9 = (psVar6->field_2).field_4.args;
      psVar11 = (psVar6->field_2).field_8.iterator_statement;
      (expr->field_5).field_10.cond_false = (psVar6->field_2).field_8.iterator_pre_condition;
      (expr->field_5).field_14.ident_expression = (expression *)psVar11;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar8;
      (expr->field_5).field_2.string = (string *)psVar9;
      expr->ctype = (symbol *)psVar10;
      *(expression **)&expr->field_0x18 = peVar28;
      *(statement_type *)&expr->field_0x0 = sVar18;
      expr->op = uVar19;
      expr->pos = pVar45;
      return (symbol *)type_00;
    case 0x2a:
      if (((char)psVar6->type == STMT_LABEL) && (*(int *)&psVar6->pos == 0x26)) {
        psVar6 = (psVar6->field_2).field_3.if_false;
        uVar19 = *(undefined4 *)&(psVar6->pos).field_0x0;
        pVar45 = *(position *)&(psVar6->pos).field_0x4;
        psVar10 = (psVar6->field_2).field_0.declaration;
        peVar28 = (psVar6->field_2).field_1.context;
        psVar8 = (psVar6->field_2).field_3.if_false;
        psVar9 = (psVar6->field_2).field_4.args;
        peVar27 = (psVar6->field_2).field_8.iterator_pre_condition;
        psVar11 = (psVar6->field_2).field_8.iterator_statement;
        *(statement_type *)&expr->field_0x0 = psVar6->type;
        expr->op = uVar19;
        expr->pos = pVar45;
        expr->ctype = (symbol *)psVar10;
        *(expression **)&expr->field_0x18 = peVar28;
        (expr->field_5).field_10.cond_false = peVar27;
        (expr->field_5).field_14.ident_expression = (expression *)psVar11;
        (expr->field_5).field_0.value = (unsigned_long_long)psVar8;
        (expr->field_5).field_2.string = (string *)psVar9;
        expr->field_0x1 = 0;
        goto LAB_0010bcbd;
      }
      dmrC_examine_symbol_type(C->S,(symbol *)type_00);
      if (*(char *)type_00 == '\x03') {
        type_00 = (statement_list *)type_00->list_[0xc];
      }
      peVar25 = (expression_list *)dmrC_alloc_symbol(C->S,expr->pos,3);
      psVar8 = type_00->list_[0xc];
      if (*(char *)type_00 == '\x04') {
        peVar25->list_[8] =
             (expression *)(ulong)((uint)*(undefined8 *)&psVar8[1].field_2 & 0x40001fc0);
      }
      else {
        if (*(char *)type_00 != '\x06') {
          pcVar43 = "cannot dereference this type";
          goto LAB_0010afff;
        }
        if (((char)psVar6->type != STMT_LABEL) || (*(int *)&psVar6->pos != 0x2a)) {
          pcVar43 = "non-lvalue array??";
          psVar26 = (symbol *)0x0;
          expr = (expression *)psVar6;
          goto LAB_0010b9a0;
        }
        psVar9 = (psVar6->field_2).field_3.if_false;
        sVar18 = psVar9->type;
        uVar19 = *(undefined4 *)&(psVar9->pos).field_0x0;
        uVar12 = *(undefined8 *)&(psVar9->pos).field_0x4;
        peVar28 = (psVar9->field_2).field_1.context;
        psVar11 = (psVar9->field_2).field_3.if_false;
        psVar13 = (psVar9->field_2).field_4.args;
        peVar27 = (psVar9->field_2).field_8.iterator_pre_condition;
        psVar14 = (psVar9->field_2).field_8.iterator_statement;
        (psVar6->field_2).field_0.declaration = (psVar9->field_2).field_0.declaration;
        (psVar6->field_2).field_1.context = peVar28;
        psVar6->type = sVar18;
        *(undefined4 *)&(psVar6->pos).field_0x0 = uVar19;
        *(undefined8 *)&(psVar6->pos).field_0x4 = uVar12;
        (psVar6->field_2).field_8.iterator_pre_condition = peVar27;
        (psVar6->field_2).field_8.iterator_statement = psVar14;
        (psVar6->field_2).field_3.if_false = psVar11;
        (psVar6->field_2).field_4.args = psVar13;
        dmrC_merge_type((symbol *)peVar25,(psVar6->field_2).field_5.label_identifier);
      }
      dmrC_merge_type((symbol *)peVar25,(symbol *)type_00);
      *(statement_type *)(peVar25->list_ + 6) = psVar8[1].type;
      peVar25->list_[7] = *(expression **)&psVar8[1].pos.field_0x4;
      argtypeiter__._16_8_ = peVar25;
      goto LAB_0010b50a;
    case 0x2b:
    case 0x2d:
      goto switchD_0010a78f_caseD_2b;
    }
    if (iVar22 != 0x7e) {
      if ((iVar22 == 0x101) || (iVar22 == 0x103)) goto LAB_0010a215;
      goto switchD_0010a78f_caseD_22;
    }
switchD_0010a78f_caseD_2b:
    argtypeiter__._16_8_ = type_00;
    uVar23 = classify_type(C,(symbol *)type_00,(symbol **)&argtypeiter__.__nr);
    if ((0xff < *(ushort *)expr) && ((((expr->field_5).statement)->type & 0x100) == STMT_NONE)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if ((uVar23 & 1) == 0) {
LAB_0010c0c0:
      psVar26 = bad_expr_type(C,expr);
      return psVar26;
    }
    if (((uVar23 & 4) != 0) &&
       (iVar22 = restricted_unop(C,expr->op,(symbol **)&argtypeiter__.__nr), iVar22 != 0)) {
      unrestrict(C,expr,uVar23,(symbol **)&argtypeiter__.__nr);
    }
    if ((uVar23 & 8) == 0) {
      argtypeiter__._16_8_ = integer_promotion(C,(symbol *)argtypeiter__._16_8_);
      peVar28 = cast_to(C,(expr->field_5).field_3.unop,(symbol *)argtypeiter__._16_8_);
      (expr->field_5).field_3.unop = peVar28;
      iVar22 = expr->op;
    }
    else {
      iVar22 = expr->op;
      if (iVar22 == 0x7e) goto LAB_0010c0c0;
    }
    if (iVar22 == 0x2b) {
      psVar26 = (expr->field_5).field_4.symbol;
      uVar19 = *(undefined4 *)&(psVar26->pos).field_0x0;
      pVar45 = *(position *)&(psVar26->pos).field_0x4;
      psVar37 = *(symbol **)&(psVar26->endpos).field_0x4;
      piVar15 = psVar26->ident;
      psVar38 = psVar26->next_id;
      psVar36 = psVar26->replace;
      peVar28 = (expression *)psVar26->scope;
      aVar16 = psVar26->field_12;
      *(undefined4 *)&expr->field_0x0 = *(undefined4 *)&psVar26->field_0x0;
      expr->op = uVar19;
      expr->pos = pVar45;
      expr->ctype = psVar37;
      *(ident **)&expr->field_0x18 = piVar15;
      (expr->field_5).field_10.cond_false = peVar28;
      (expr->field_5).field_14.ident_expression = (expression *)aVar16;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar38;
      (expr->field_5).field_2.string = (string *)psVar36;
    }
    goto LAB_0010b50a;
  case 10:
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
LAB_0010a215:
    psVar26 = evaluate_postop(C,expr);
    return psVar26;
  case 0xb:
  case 0xc:
  case 0xd:
    peVar28 = (expr->field_5).field_6.right;
    if (peVar28 == (expression *)0x0) {
      return (symbol *)0x0;
    }
    if (*(char *)peVar28 != '\x18') {
      psVar26 = dmrC_examine_symbol_type(C->S,(expr->field_5).field_4.symbol);
      expr->ctype = psVar26;
      (expr->field_5).field_4.symbol = psVar26;
      dmrC_evaluate_expression(C,peVar28);
      degenerate(C,peVar28);
      uVar23 = classify_type(C,psVar26,(symbol **)&argtypeiter__.__nr);
      uVar12 = argtypeiter__._16_8_;
      if (((uVar23 & 9) != 1) ||
         (((*(ushort *)expr & 0xff00) == 0x100 && ((peVar28->field_0x1 & 1) == 0)))) {
        *(ushort *)expr = *(ushort *)expr & 0xff;
      }
      if ((symbol *)argtypeiter__._16_8_ == &C->S->void_ctype) {
        return psVar26;
      }
      if ((uVar23 & 0xa0) != 0) {
        dmrC_warning(C,expr->pos,"cast to non-scalar");
      }
      t_1 = peVar28->ctype;
      if (t_1 != (symbol *)0x0) {
        uVar21 = classify_type(C,t_1,&t_1);
        if ((uVar21 & 0x20) != 0) {
          dmrC_warning(C,expr->pos,"cast from non-scalar");
        }
        if (*(char *)expr == '\f') {
          return psVar26;
        }
        psVar37 = t_1;
        if ((uVar21 & 0x40) != 0) {
          psVar37 = (t_1->field_14).field_2.ctype.base_type;
        }
        if ((symbol *)uVar12 != psVar37) {
          if (((uVar23 & 4) != 0) &&
             ((*(char *)peVar28 != '\x01' || ((peVar28->field_5).field_0.value != 0)))) {
            dmrC_show_typename(C,(symbol *)uVar12);
            dmrC_warning(C,expr->pos,"cast to %s");
          }
          if (((uVar21 & 4) != 0) &&
             ((psVar38 = &C->S->bool_ctype, (symbol *)uVar12 != psVar38 || ((uVar21 & 0x40) != 0))))
          {
            pcVar43 = "%s degrades to integer";
            if ((symbol *)uVar12 != psVar38) {
              pcVar43 = "cast from %s";
            }
            dmrC_show_typename(C,psVar37);
            dmrC_warning(C,expr->pos,pcVar43);
          }
        }
        pgVar46 = C->S;
        if ((symbol *)uVar12 == &pgVar46->ulong_ctype) {
          uVar24 = 0xffffffff;
        }
        else {
          uVar24 = 0;
          if (uVar23 == 0x10) {
            dmrC_examine_pointer_target(pgVar46,(symbol *)uVar12);
            uVar24 = *(uint *)(uVar12 + 0x78);
            pgVar46 = C->S;
          }
        }
        uVar47 = 0xffffffff;
        bVar51 = false;
        if (psVar37 != &pgVar46->ulong_ctype) {
          if (uVar21 == 0x10) {
            dmrC_examine_pointer_target(pgVar46,psVar37);
            uVar47 = *(uint *)((long)&psVar37->field_14 + 0x30);
            bVar51 = 0 < (int)uVar47;
            if ((uVar24 == 0) && (0 < (int)uVar47)) {
              dmrC_warning(C,expr->pos,"cast removes address space of expression");
              bVar51 = true;
            }
          }
          else {
            uVar47 = 0;
            bVar51 = false;
          }
        }
        if (((0 < (int)uVar24) && (bVar51)) && (uVar24 != uVar47)) {
          dmrC_warning(C,expr->pos,"cast between address spaces (<asn:%d>-><asn:%d>)",(ulong)uVar47,
                       uVar24);
        }
        if (((0 < (int)uVar24) && (uVar47 == 0)) &&
           ((iVar22 = is_null_pointer_constant(C,peVar28), iVar22 == 0 && (C->Wcast_to_as != 0)))) {
          dmrC_warning(C,expr->pos,"cast adds address space to expression (<asn:%d>)");
        }
        if (((uVar23 == 0x10) && ((*(ulong *)(uVar12 + 0x60) & 0x20300030) == 0)) &&
           ((uVar24 == 0 &&
            ((((peVar28->field_0x1 & 1) != 0 &&
              ((symbol *)*(undefined1 **)(uVar12 + 0x80) == &C->S->void_ctype)) &&
             (iVar22 = dmrC_is_zero_constant(C,peVar28), iVar22 != 0)))))) {
          *(undefined1 *)expr = 1;
          psVar26 = &C->S->null_ctype;
          expr->ctype = psVar26;
          (expr->field_5).field_0.value = 0;
          return psVar26;
        }
        if ((symbol *)uVar12 == &C->S->bool_ctype) {
          cast_to_bool(C,expr);
          return psVar26;
        }
        return psVar26;
      }
      pcVar43 = "cast from unknown type";
      t_1 = (symbol *)0x0;
      goto LAB_0010b9a0;
    }
    peVar25 = (expr->field_5).expr_list;
    psVar26 = (symbol *)dmrC_alloc_expression(C,expr->pos,3);
    peVar25->list_[0x12] = peVar28;
    evaluate_symbol(C,(symbol *)peVar25);
    *(symbol **)&(psVar26->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
    ((anon_union_32_18_55d8ca1e_for_expression_5 *)&psVar26->next_id)->expr_list = peVar25;
LAB_00109e6b:
    *(undefined1 *)expr = 9;
    expr->op = 0x2a;
    (expr->field_5).field_4.symbol = psVar26;
    argtypeiter__._16_8_ = peVar25;
    goto LAB_0010b50a;
  case 0xe:
    psVar26 = evaluate_type_information(C,expr);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    uVar23 = (psVar26->field_14).field_1.normal;
    if ((int)uVar23 < 0) {
      psVar37 = psVar26;
      if (*(char *)psVar26 == '\x03') {
        psVar37 = (psVar26->field_14).field_2.ctype.base_type;
      }
      if (psVar37 == &C->S->void_ctype) {
        dmrC_warning(C,expr->pos,"expression using sizeof(void)");
        uVar23 = C->target->bits_in_char;
        goto LAB_0010a66f;
      }
    }
    else {
LAB_0010a66f:
      if (uVar23 == 1) {
        psVar37 = psVar26;
        if (*(char *)psVar26 == '\x03') {
          psVar37 = (psVar26->field_14).field_2.ctype.base_type;
        }
        if (psVar37 == &C->S->bool_ctype) {
          if (C->Wsizeof_bool != 0) {
            dmrC_warning(C,expr->pos,"expression using sizeof bool");
          }
          uVar23 = C->target->bits_in_char;
        }
        else {
          uVar23 = 1;
        }
      }
    }
    psVar26 = (psVar26->field_14).field_2.ctype.base_type;
    if ((psVar26 != (symbol *)0x0) && (*(char *)psVar26 == '\x05')) {
      dmrC_warning(C,expr->pos,"expression using sizeof on a function");
      uVar23 = C->target->bits_in_char;
    }
    if (((int)uVar23 < 0) || ((C->target->bits_in_char + 0x7fffffffU & uVar23) != 0)) {
      dmrC_expression_error(C,expr,"cannot size expression");
    }
    *(undefined1 *)expr = 1;
    if ((int)uVar23 < 0) {
      lVar50 = -1;
    }
    else {
      iVar22 = C->target->bits_in_char;
      lVar50 = (long)((int)(uVar23 + iVar22 + -1) / iVar22);
    }
    *(long *)&expr->field_5 = lVar50;
    (expr->field_5).field_0.taint = 0;
    ptVar29 = C->target;
    goto LAB_0010b507;
  case 0xf:
    psVar26 = evaluate_type_information(C,expr);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    *(undefined1 *)expr = 1;
    uVar39 = (psVar26->field_14).field_2.ctype.alignment;
LAB_0010b35a:
    *(unsigned_long *)&expr->field_5 = uVar39;
    (expr->field_5).field_0.taint = 0;
    ptVar29 = C->target;
LAB_0010b507:
    argtypeiter__._16_8_ = (expression_list *)ptVar29->size_t_ctype;
    goto LAB_0010b50a;
  case 0x10:
    psVar26 = evaluate_type_information(C,expr);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    uVar23 = (uint)*(byte *)psVar26;
    if (*(byte *)psVar26 == 3) {
      psVar26 = *(symbol **)((long)&psVar26->field_14 + 0x38);
      if (psVar26 == (symbol *)0x0) {
        return (symbol *)0x0;
      }
      uVar23 = *(uint *)psVar26;
    }
    if (((char)uVar23 == '\x06') ||
       (((uVar23 & 0xff) == 4 &&
        (psVar26 = dmrC_get_base_type(C->S,psVar26), psVar26 != (symbol *)0x0)))) {
      uVar23 = (psVar26->field_14).field_1.normal;
      uVar21 = 0;
      if ((C->target->bits_in_char - 1U & uVar23) == 0) {
        uVar21 = uVar23;
      }
      *(undefined1 *)expr = 1;
      if ((int)uVar21 < 0) {
        uVar39 = 0xffffffffffffffff;
      }
      else {
        iVar22 = C->target->bits_in_char;
        uVar39 = (unsigned_long)((int)(uVar21 + iVar22 + -1) / iVar22);
      }
      goto LAB_0010b35a;
    }
    pcVar43 = "expected pointer expression";
    break;
  case 0x11:
  case 0x12:
    psVar26 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_10.cond_false);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar37 = degenerate(C,(expr->field_5).field_3.unop);
    psVar26 = degenerate(C,(expr->field_5).field_10.cond_false);
    peVar28 = (expr->field_5).field_6.right;
    t_1 = psVar26;
    if (peVar28 == (expression *)0x0) {
      paVar49 = &expr->field_5;
    }
    else {
      argtypeiter__._16_8_ = psVar37;
      psVar37 = dmrC_evaluate_expression(C,peVar28);
      if (psVar37 == (symbol *)0x0) {
        return (symbol *)0x0;
      }
      paVar49 = (anon_union_32_18_55d8ca1e_for_expression_5 *)((long)&expr->field_5 + 8);
      psVar37 = degenerate(C,(paVar49->field_3).unop);
    }
    if ((0xff < *(ushort *)expr) &&
       (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(paVar49->field_3).unop &
         *(ushort *)(expr->field_5).field_10.cond_false) >> 8 & 1) == 0)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    argtypeiter__._16_8_ = psVar37;
    uVar23 = classify_type(C,psVar37,(symbol **)&argtypeiter__.__nr);
    uVar21 = classify_type(C,psVar26,&t_1);
    if ((uVar21 & uVar23 & 1) == 0) {
      if (((uVar21 | uVar23) & 0x10) == 0) {
        psVar26 = (symbol *)argtypeiter__._16_8_;
        if ((symbol *)argtypeiter__._16_8_ == t_1) goto LAB_0010ad2f;
        pcVar43 = "different base types";
      }
      else {
        iVar22 = is_null_pointer_constant(C,(paVar49->field_3).unop);
        iVar42 = is_null_pointer_constant(C,(expr->field_5).field_10.cond_false);
        uVar12 = argtypeiter__._16_8_;
        psVar26 = t_1;
        if (iVar42 != 0 && iVar22 != 0) {
          peVar28 = cast_to(C,(paVar49->field_3).unop,&C->S->ptr_ctype);
          (paVar49->field_3).unop = peVar28;
          peVar28 = cast_to(C,(expr->field_5).field_10.cond_false,&C->S->ptr_ctype);
          (expr->field_5).field_10.cond_false = peVar28;
          psVar26 = &C->S->ptr_ctype;
          argtypeiter__._16_8_ = psVar26;
          goto LAB_0010ad2f;
        }
        if ((uVar21 & 0x10) != 0 && iVar22 != 0) {
          if (iVar22 == 2) {
            bad_null(C,(paVar49->field_3).unop);
          }
          psVar26 = t_1;
          peVar28 = cast_to(C,(paVar49->field_3).unop,t_1);
          (paVar49->field_3).unop = peVar28;
          argtypeiter__._16_8_ = psVar26;
          goto LAB_0010ad2f;
        }
        if ((iVar42 != 0) && ((uVar23 & 0x10) != 0)) {
          if (iVar42 == 2) {
            bad_null(C,(expr->field_5).field_10.cond_false);
          }
          peVar28 = (expr->field_5).field_10.cond_false;
          psVar26 = (symbol *)argtypeiter__._16_8_;
          goto LAB_0010ad1d;
        }
        if ((uVar21 & uVar23 & 0x10) == 0) {
          pcVar43 = "different types";
        }
        else if (*(int *)(argtypeiter__._16_8_ + 0x78) == *(int *)((long)&t_1->field_14 + 0x30)) {
          psVar38 = dmrC_examine_pointer_target(C->S,(symbol *)argtypeiter__._16_8_);
          psVar37 = psVar26;
          expriter__._16_8_ = dmrC_examine_pointer_target(C->S,psVar26);
          uVar39 = target_qualifiers((dmr_C *)uVar12,psVar37);
          uVar40 = target_qualifiers((dmr_C *)psVar26,psVar37);
          uVar35 = uVar40 | uVar39;
          psVar36 = &C->S->void_ctype;
          psVar37 = (symbol *)uVar12;
          if (((psVar38 == psVar36) || (psVar37 = psVar26, (symbol *)expriter__._16_8_ == psVar36))
             || (pcVar43 = dmrC_type_difference
                                     (C,(ctype *)(uVar12 + 0x60),&(psVar26->field_14).field_2.ctype,
                                      uVar35,uVar35), psVar37 = (symbol *)uVar12,
                pcVar43 == (char *)0x0)) {
            psVar26 = psVar37;
            if ((uVar35 & ~(psVar37->field_14).field_2.ctype.modifiers) != 0) {
              psVar26 = dmrC_alloc_symbol(C->S,psVar37->pos,4);
              memcpy(psVar26,psVar37,0xe8);
              pcVar17 = &(psVar26->field_14).field_2.ctype;
              pcVar17->modifiers = pcVar17->modifiers | uVar35;
            }
            peVar28 = (paVar49->field_3).unop;
            goto LAB_0010ad11;
          }
        }
        else {
          pcVar43 = "different address spaces";
        }
      }
      dmrC_expression_error(C,expr,"incompatible types in conditional expression (%s)",pcVar43);
      iVar22 = dmrC_expr_truth_value(C,(expr->field_5).field_3.unop);
      if ((iVar22 != 0) && (t_1 = (symbol *)argtypeiter__._16_8_, iVar22 != 1)) {
        return (symbol *)0x0;
      }
      psVar26 = t_1;
      argtypeiter__._16_8_ = (symbol *)0x0;
    }
    else {
      psVar26 = usual_conversions(C,0x3f,(paVar49->field_3).unop,(expr->field_5).field_10.cond_false
                                  ,uVar23,uVar21,(symbol *)argtypeiter__._16_8_,t_1);
      peVar28 = (paVar49->field_3).unop;
LAB_0010ad11:
      peVar28 = cast_to(C,peVar28,psVar26);
      (paVar49->field_3).unop = peVar28;
      peVar28 = (expr->field_5).field_10.cond_false;
LAB_0010ad1d:
      peVar28 = cast_to(C,peVar28,psVar26);
      (expr->field_5).field_10.cond_false = peVar28;
      argtypeiter__._16_8_ = psVar26;
    }
LAB_0010ad2f:
    expr->ctype = psVar26;
    return (symbol *)argtypeiter__._16_8_;
  case 0x13:
    psVar26 = dmrC_evaluate_statement(C,(expr->field_5).statement);
LAB_0010a6b5:
    expr->ctype = psVar26;
    return psVar26;
  case 0x14:
    peVar28 = (expr->field_5).field_3.unop;
    ppVar4 = (ptr_list *)(expr->field_5).field_2.string;
    psVar26 = dmrC_evaluate_expression(C,peVar28);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = peVar28->ctype;
    cVar20 = *(char *)psVar26;
    psVar37 = psVar26;
    if (cVar20 == '\x03') {
      psVar37 = *(symbol **)((long)&psVar26->field_14 + 0x38);
      cVar20 = *(char *)psVar37;
    }
    if (cVar20 == '\x04') {
      psVar37 = dmrC_get_base_type(C->S,psVar37);
      cVar20 = *(char *)psVar37;
    }
    if (cVar20 != '\x05') {
      pcVar43 = dmrC_show_ident(C,psVar26->ident);
      dmrC_expression_error(C,expr,"not a function %s",pcVar43);
      ptrlist_forward_iterator((ptr_list_iter *)&argtypeiter__.__nr,ppVar4);
      while (peVar28 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argtypeiter__.__nr),
            peVar28 != (expression *)0x0) {
        dmrC_evaluate_expression(C,peVar28);
      }
      return (symbol *)0x0;
    }
    examine_fn_arguments(C,psVar37);
    if ((((*(char *)psVar26 == '\x03') && (*(char *)peVar28 == '\t')) &&
        (psVar26->op != (symbol_op *)0x0)) &&
       (p_Var5 = psVar26->op->args, p_Var5 != (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
      iVar22 = (*p_Var5)(C,expr);
      if (iVar22 == 0) {
        return (symbol *)0x0;
      }
    }
    else {
      ptrlist_forward_iterator
                ((ptr_list_iter *)&t_1,(ptr_list *)(psVar37->field_14).field_2.arguments);
      local_38 = (symbol *)ptrlist_iter_next((ptr_list_iter *)&t_1);
      uVar35 = 1;
      ptrlist_forward_iterator((ptr_list_iter *)local_a8,ppVar4);
      while (peVar28 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_a8),
            ppVar4 = expriter__.__head, peVar28 != (expression *)0x0) {
        lVar50 = (long)(int)expriter__.__list;
        psVar38 = dmrC_evaluate_expression(C,peVar28);
        if (psVar38 == (symbol *)0x0) {
          return (symbol *)0x0;
        }
        rp = ppVar4->list_ + lVar50;
        if (local_38 == (symbol *)0x0) {
          uVar23 = classify_type(C,psVar38,(symbol **)&argtypeiter__.__nr);
          if ((uVar23 & 9) == 1) {
            psVar38 = integer_promotion(C,(symbol *)argtypeiter__._16_8_);
            peVar28 = cast_to(C,peVar28,psVar38);
            *rp = peVar28;
          }
          else if ((uVar23 & 8) == 0) {
            if ((uVar23 & 0x10) != 0) {
              if (peVar28->ctype == &C->S->null_ctype) {
                psVar38 = &C->S->ptr_ctype;
                goto LAB_0010af1a;
              }
              degenerate(C,peVar28);
            }
          }
          else if ((*(byte *)(argtypeiter__._16_8_ + 0x61) & 0x1c) == 0) {
            psVar38 = &C->S->double_ctype;
LAB_0010af1a:
            peVar28 = cast_to(C,peVar28,psVar38);
            *rp = peVar28;
          }
        }
        else if ((undefined1  [136])
                 ((undefined1  [136])local_38->field_14 & (undefined1  [136])0x200000000000000) ==
                 (undefined1  [136])0x0) {
          dmrC_examine_symbol_type(C->S,local_38);
          sprintf(evaluate_arguments_where,"argument %d",uVar35);
          classify_type(C,local_38,(symbol **)&local_88);
          if ((*(char *)local_88 == '\b') && ((*(byte *)((long)local_88->list_ + 0x37) & 4) != 0)) {
            ptrlist_forward_iterator
                      ((ptr_list_iter *)&argtypeiter__.__nr,(ptr_list *)local_88->list_[0xf]);
            do {
              psVar38 = (symbol *)ptrlist_iter_next((ptr_list_iter *)&argtypeiter__.__nr);
              if (psVar38 == (symbol *)0x0) goto LAB_0010ae24;
              iVar22 = check_assignment_types(C,psVar38,(expression **)rp,&local_b0);
            } while (iVar22 == 0);
          }
          else {
LAB_0010ae24:
            compatible_assignment_types
                      (C,peVar28,local_38,(expression **)rp,evaluate_arguments_where);
          }
        }
        local_38 = (symbol *)ptrlist_iter_next((ptr_list_iter *)&t_1);
        uVar35 = (ulong)((int)uVar35 + 1);
      }
      iVar22 = ptrlist_size((ptr_list *)(expr->field_5).field_2.string);
      iVar42 = ptrlist_size((ptr_list *)(psVar37->field_14).field_2.arguments);
      if (iVar22 < iVar42) {
        pcVar43 = dmrC_show_ident(C,psVar26->ident);
        dmrC_expression_error(C,expr,"not enough arguments for function %s",pcVar43);
      }
      if ((iVar42 < iVar22) &&
         ((undefined1  [136])
          ((undefined1  [136])psVar37->field_14 & (undefined1  [136])0x4000000000000) ==
          (undefined1  [136])0x0)) {
        pcVar43 = dmrC_show_ident(C,psVar26->ident);
        dmrC_expression_error(C,expr,"too many arguments for function %s",pcVar43);
      }
    }
    if ((*(char *)psVar26 == '\x03') && (*(char *)(expr->field_5).expr_list == '\t')) {
      peVar25 = ((expr->field_5).expr_list)->next_;
      if (((symbol_op *)peVar25->list_[4] == (symbol_op *)0x0) ||
         (p_Var5 = ((symbol_op *)peVar25->list_[4])->evaluate,
         p_Var5 == (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
        if ((*(byte *)((long)peVar25->list_ + 0x42) & 4) == 0) goto LAB_0010bcc6;
        psVar26 = C->current_fn;
        peVar31 = (expression_list *)peVar25->list_[0x15];
        if ((expression_list *)peVar25->list_[0x15] == (expression_list *)0x0) {
          peVar31 = peVar25;
        }
        C->current_fn = (symbol *)peVar31->list_[0xc];
        iVar22 = dmrC_inline_function(C,expr,(symbol *)peVar31);
        C->current_fn = psVar26;
      }
      else {
        iVar22 = (*p_Var5)(C,expr);
      }
      if (iVar22 != 0) {
LAB_0010bcbd:
        return expr->ctype;
      }
    }
LAB_0010bcc6:
    argtypeiter__._16_8_ = (expression_list *)(psVar37->field_14).field_2.ctype.base_type;
    goto LAB_0010b50a;
  case 0x15:
    dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = degenerate(C,(expr->field_5).field_6.right);
    expr->ctype = psVar26;
    if (psVar26 == &C->S->null_ctype) {
      psVar26 = &C->S->ptr_ctype;
      expr->ctype = psVar26;
    }
    *(ushort *)expr =
         *(ushort *)expr &
         (*(ushort *)(expr->field_5).field_2.string & *(ushort *)(expr->field_5).field_3.unop | 0xff
         );
    return psVar26;
  case 0x16:
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    psVar26 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
    if (psVar26 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    peVar28 = (expr->field_5).field_3.unop;
    peVar27 = (expr->field_5).field_6.right;
    psVar26 = degenerate(C,peVar28);
    uVar23 = classify_type(C,psVar26,(symbol **)&argtypeiter__.__nr);
    psVar26 = degenerate(C,peVar27);
    uVar21 = classify_type(C,psVar26,&t_1);
    pdVar48 = (dmr_C *)argtypeiter__._16_8_;
    iVar22 = (int)psVar26;
    if ((0xff < *(ushort *)expr) &&
       (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(expr->field_5).field_2.string) >> 8
        & 1) == 0)) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if (((*(byte *)(argtypeiter__._16_8_ + 99) & 4) == 0) ||
       ((*(byte *)((long)&t_1->field_14 + 0x1b) & 4) == 0)) {
      if (((*(byte *)((long)&peVar28->ctype->field_14 + 0x1b) & 8) != 0) ||
         ((*(byte *)((long)&peVar27->ctype->field_14 + 0x1b) & 8) != 0)) {
        pVar45 = expr->pos;
        dmrC_warning(C,pVar45,"testing a \'safe expression\'");
        iVar22 = pVar45._0_4_;
      }
      uVar12 = argtypeiter__._16_8_;
      if ((uVar21 & uVar23 & 1) == 0) {
        if (((uVar21 | uVar23) & 0x10) == 0) goto LAB_0010c0c0;
        if ((expr->op & 0xfffffffeU) == 0x10a) {
          argtypeiter__.__nr = (int)pdVar48;
          argtypeiter__._20_4_ = SUB84(pdVar48,4);
          expriter__.__nr = argtypeiter__.__nr;
          expriter__._20_4_ = argtypeiter__._20_4_;
          argtypeiter__._16_8_ = uVar12;
          iVar22 = is_null_pointer_constant(C,peVar28);
          iVar42 = is_null_pointer_constant(C,peVar27);
          if (iVar22 == 2) {
            bad_null(C,peVar28);
          }
          if (iVar42 == 2) {
            bad_null(C,peVar27);
          }
          if (iVar42 != 0 && iVar22 != 0) {
            *(undefined1 *)expr = 1;
            *(ulong *)&expr->field_5 = (ulong)(expr->op == 0x10a);
            goto LAB_0010b226;
          }
          if (((iVar22 == 0) || (type = (dmr_C *)t_1, peVar33 = peVar28, (uVar21 & 0x10) == 0)) &&
             ((pdVar48 = (dmr_C *)expriter__._16_8_, iVar42 == 0 ||
              (type = (dmr_C *)expriter__._16_8_, peVar33 = peVar27, (uVar23 & 0x10) == 0))))
          goto LAB_0010c0b6;
        }
        else {
LAB_0010c0b6:
          if ((uVar21 & uVar23 & 0x10) == 0) goto LAB_0010c0c0;
          iVar22 = modify_for_unsigned((dmr_C *)(ulong)(uint)expr->op,iVar22);
          expr->op = iVar22;
          psVar37 = dmrC_examine_pointer_target(C->S,(symbol *)pdVar48);
          psVar26 = t_1;
          psVar38 = dmrC_examine_pointer_target(C->S,t_1);
          if ((((expr->op & 0xfffffffeU) != 0x10a) ||
              (*(int *)&(pdVar48->token_allocator).blobs_ != *(int *)((long)&t_1->field_14 + 0x30)))
             || ((psVar36 = &C->S->void_ctype, type = pdVar48, peVar33 = peVar27, psVar37 != psVar36
                 && (type = (dmr_C *)t_1, peVar33 = peVar28, psVar38 != psVar36)))) {
            uVar39 = target_qualifiers((dmr_C *)t_1,psVar26);
            uVar40 = target_qualifiers(pdVar48,psVar26);
            pcVar43 = dmrC_type_difference
                                (C,(ctype *)&(pdVar48->ptrlist_allocator).total_bytes,
                                 &(t_1->field_14).field_2.ctype,uVar39,uVar40);
            if (pcVar43 != (char *)0x0) {
              pcVar44 = "incompatible types in comparison expression (%s)";
LAB_0010af5e:
              dmrC_expression_error(C,expr,pcVar44,pcVar43);
              return (symbol *)0x0;
            }
            goto LAB_0010b226;
          }
        }
        cast_to(C,peVar33,(symbol *)type);
      }
      else {
        psVar26 = usual_conversions(C,expr->op,(expr->field_5).field_3.unop,
                                    (expr->field_5).field_6.right,uVar23,uVar21,(symbol *)pdVar48,
                                    t_1);
        peVar28 = cast_to(C,(expr->field_5).field_3.unop,psVar26);
        (expr->field_5).field_3.unop = peVar28;
        peVar28 = (expr->field_5).field_6.right;
        peVar27 = cast_to(C,peVar28,psVar26);
        (expr->field_5).field_6.right = peVar27;
        if ((*(byte *)((long)&psVar26->field_14 + 0x18) & 0x80) != 0) {
          iVar22 = modify_for_unsigned((dmr_C *)(ulong)(uint)expr->op,(int)peVar28);
          expr->op = iVar22;
        }
      }
    }
LAB_0010b226:
    lVar50 = 0xa00;
    goto LAB_0010b22c;
  case 0x17:
    lVar50 = 0x1880;
LAB_0010b22c:
    argtypeiter__._16_8_ = (expression_list *)((long)&C->S->C + lVar50);
LAB_0010b50a:
    expr->ctype = (symbol *)argtypeiter__._16_8_;
    return (symbol *)(expression_list *)argtypeiter__._16_8_;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    pcVar43 = "internal front-end error: initializer in expression";
    break;
  case 0x1d:
    pcVar43 = "internal front-end error: SLICE re-evaluated";
    break;
  case 0x1e:
    peVar28 = (expr->field_5).field_6.right;
    psVar26 = (expr->field_5).field_4.symbol;
    argtypeiter__._16_8_ = psVar26;
    if (expr->op == 0x2e) {
      t_1 = (symbol *)((ulong)t_1 & 0xffffffff00000000);
      if (psVar26 != (symbol *)0x0) {
        dmrC_examine_symbol_type(C->S,psVar26);
        iVar22 = classify_type(C,psVar26,(symbol **)&argtypeiter__.__nr);
        if (iVar22 == 0x20) {
          psVar26 = find_identifier((dmr_C *)(expr->field_5).field_10.cond_false,
                                    *(ident **)(argtypeiter__._16_8_ + 0x98),(symbol_list *)&t_1,
                                    (int *)offset);
          if (psVar26 == (symbol *)0x0) {
            pcVar43 = "unknown member";
            goto LAB_0010aba2;
          }
          *(undefined2 *)expr = 0x101;
          *(long *)&expr->field_5 = (long)(int)t_1;
LAB_0010b7f3:
          (expr->field_5).field_0.taint = 0;
          expr->ctype = C->target->size_t_ctype;
LAB_0010bdf0:
          if (peVar28 != (expression *)0x0) {
            psVar34 = (symbol *)dmrC_allocator_allocate(&C->expression_allocator,0);
            uVar19 = *(undefined4 *)&expr->field_0x0;
            iVar22 = expr->op;
            pVar45 = expr->pos;
            psVar37 = expr->ctype;
            piVar15 = *(ident **)&expr->field_0x18;
            psVar38 = (symbol *)(expr->field_5).field_0.value;
            psVar36 = (symbol *)(expr->field_5).field_2.string;
            aVar16 = (anon_union_8_2_e1606681_for_symbol_12)
                     (expr->field_5).field_14.ident_expression;
            psVar34->scope = (scope *)(expr->field_5).field_10.cond_false;
            psVar34->field_12 = aVar16;
            psVar34->next_id = psVar38;
            psVar34->replace = psVar36;
            *(symbol **)&(psVar34->endpos).field_0x4 = psVar37;
            psVar34->ident = piVar15;
            *(undefined4 *)&psVar34->field_0x0 = uVar19;
            *(int *)&(psVar34->pos).field_0x0 = iVar22;
            *(position *)&(psVar34->pos).field_0x4 = pVar45;
            if (*(char *)peVar28 == '\x1e') {
              (peVar28->field_5).field_4.symbol = psVar26;
            }
            psVar26 = dmrC_evaluate_expression(C,peVar28);
            if (psVar26 == (symbol *)0x0) {
              return (symbol *)0x0;
            }
            *(undefined1 *)expr = 5;
            *(ushort *)expr = *(ushort *)peVar28 & *(ushort *)psVar34 & 0x100 | 5;
            expr->op = 0x2b;
            expr->ctype = C->target->size_t_ctype;
            (expr->field_5).field_4.symbol = psVar34;
            (expr->field_5).field_6.right = peVar28;
          }
          return C->target->size_t_ctype;
        }
      }
      pcVar43 = "expected structure or union";
      goto LAB_0010aba2;
    }
    if (psVar26 == (symbol *)0x0) {
      pcVar43 = "expected structure or union";
    }
    else {
      dmrC_examine_symbol_type(C->S,psVar26);
      iVar22 = classify_type(C,psVar26,(symbol **)&argtypeiter__.__nr);
      if (iVar22 == 0x30) {
        psVar26 = *(symbol **)(argtypeiter__._16_8_ + 0x80);
        peVar27 = (expr->field_5).field_10.cond_false;
        if (peVar27 == (expression *)0x0) {
          *(undefined2 *)expr = 0x101;
          (expr->field_5).field_0.value = 0;
          goto LAB_0010b7f3;
        }
        t_1 = dmrC_evaluate_expression(C,peVar27);
        uVar23 = classify_type(C,t_1,&t_1);
        if ((uVar23 & 9) == 1) {
          unrestrict(C,peVar27,uVar23,&t_1);
          peVar27 = cast_to(C,peVar27,C->target->size_t_ctype);
          iVar22 = (psVar26->field_14).field_1.normal;
          if (iVar22 < 0) {
            iVar42 = -1;
          }
          else {
            iVar42 = C->target->bits_in_char;
            iVar42 = (iVar22 + iVar42 + -1) / iVar42;
          }
          peVar33 = dmrC_alloc_const_expression(C,expr->pos,iVar42);
          peVar33->ctype = C->target->size_t_ctype;
          peVar33->field_0x1 = 1;
          *(undefined1 *)expr = 5;
          (expr->field_5).field_3.unop = peVar27;
          (expr->field_5).field_6.right = peVar33;
          expr->op = 0x2a;
          expr->ctype = C->target->size_t_ctype;
          *(ushort *)expr = *(ushort *)peVar33 & *(ushort *)peVar27 & 0x100 | 5;
          goto LAB_0010bdf0;
        }
        pcVar43 = "non-integer index";
      }
      else {
        pcVar43 = "expected array";
      }
    }
    break;
  default:
    return (symbol *)0x0;
  }
LAB_0010b997:
  psVar26 = (symbol *)0x0;
LAB_0010b9a0:
  dmrC_expression_error(C,expr,pcVar43);
  return psVar26;
}

Assistant:

struct symbol *dmrC_evaluate_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;
	if (expr->ctype)
		return expr->ctype;

	switch (expr->type) {
	case EXPR_VALUE:
	case EXPR_FVALUE:
		dmrC_expression_error(C, expr, "value expression without a type");
		return NULL;
	case EXPR_STRING:
		return evaluate_string(C, expr);
	case EXPR_SYMBOL:
		return evaluate_symbol_expression(C, expr);
	case EXPR_BINOP:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_binop(C, expr);
	case EXPR_LOGICAL:
		return evaluate_logical(C, expr);
	case EXPR_COMMA:
		dmrC_evaluate_expression(C, expr->left);
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_comma(C, expr);
	case EXPR_COMPARE:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_compare(C, expr);
	case EXPR_ASSIGNMENT:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_assignment(C, expr);
	case EXPR_PREOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_preop(C, expr);
	case EXPR_POSTOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_postop(C, expr);
	case EXPR_CAST:
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
		return evaluate_cast(C, expr);
	case EXPR_SIZEOF:
		return evaluate_sizeof(C, expr);
	case EXPR_PTRSIZEOF:
		return evaluate_ptrsizeof(C, expr);
	case EXPR_ALIGNOF:
		return evaluate_alignof(C, expr);
	case EXPR_DEREF:
		return evaluate_member_dereference(C, expr);
	case EXPR_CALL:
		return evaluate_call(C, expr);
	case EXPR_SELECT:
	case EXPR_CONDITIONAL:
		return evaluate_conditional_expression(C, expr);
	case EXPR_STATEMENT:
		expr->ctype = dmrC_evaluate_statement(C, expr->statement);
		return expr->ctype;

	case EXPR_LABEL:
		expr->ctype = &C->S->ptr_ctype;
		return &C->S->ptr_ctype;

	case EXPR_TYPE:
		/* Evaluate the type of the symbol .. */
		evaluate_symbol(C, expr->symbol);
		/* .. but the type of the _expression_ is a "type" */
		expr->ctype = &C->S->type_ctype;
		return &C->S->type_ctype;

	case EXPR_OFFSETOF:
		return evaluate_offsetof(C, expr);

	/* These can not exist as stand-alone expressions */
	case EXPR_INITIALIZER:
	case EXPR_IDENTIFIER:
	case EXPR_INDEX:
	case EXPR_POS:
		dmrC_expression_error(C, expr, "internal front-end error: initializer in expression");
		return NULL;
	case EXPR_SLICE:
		dmrC_expression_error(C, expr, "internal front-end error: SLICE re-evaluated");
		return NULL;
	}
	return NULL;
}